

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O2

void int_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                   JSAMPARRAY output_data)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  JSAMPROW pJVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  
  iVar7 = compptr->DCT_h_scaled_size * compptr->width_in_blocks;
  bVar1 = *(byte *)((long)&cinfo->downsample[6].start_pass + (long)compptr->component_index);
  bVar2 = *(byte *)((long)&cinfo->downsample[6].downsample + (long)compptr->component_index + 2);
  uVar11 = (uint)bVar2 * (uint)bVar1;
  expand_right_edge(input_data,cinfo->max_v_samp_factor,cinfo->image_width,iVar7 * (uint)bVar1);
  lVar6 = 0;
  for (lVar4 = 0; lVar4 < cinfo->max_v_samp_factor; lVar4 = lVar4 + (ulong)bVar2) {
    pJVar8 = output_data[lVar6];
    uVar10 = 0;
    for (iVar9 = 0; iVar9 != iVar7; iVar9 = iVar9 + 1) {
      lVar3 = 0;
      for (uVar5 = 0; uVar5 != bVar2; uVar5 = uVar5 + 1) {
        for (lVar12 = 0; (uint)bVar1 != (uint)lVar12; lVar12 = lVar12 + 1) {
          lVar3 = lVar3 + (ulong)input_data[lVar4 + uVar5][lVar12 + uVar10];
        }
      }
      *pJVar8 = (JSAMPLE)((long)(lVar3 + (ulong)(uVar11 >> 1)) / (long)(ulong)uVar11);
      pJVar8 = pJVar8 + 1;
      uVar10 = (ulong)((int)uVar10 + (uint)bVar1);
    }
    lVar6 = lVar6 + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
int_downsample (j_compress_ptr cinfo, jpeg_component_info * compptr,
		JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  my_downsample_ptr downsample = (my_downsample_ptr) cinfo->downsample;
  int inrow, outrow, h_expand, v_expand, numpix, numpix2, h, v;
  JDIMENSION outcol, outcol_h;	/* outcol_h == outcol*h_expand */
  JDIMENSION output_cols = compptr->width_in_blocks * compptr->DCT_h_scaled_size;
  JSAMPROW inptr, outptr;
  INT32 outvalue;

  h_expand = downsample->h_expand[compptr->component_index];
  v_expand = downsample->v_expand[compptr->component_index];
  numpix = h_expand * v_expand;
  numpix2 = numpix/2;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data, cinfo->max_v_samp_factor,
		    cinfo->image_width, output_cols * h_expand);

  inrow = outrow = 0;
  while (inrow < cinfo->max_v_samp_factor) {
    outptr = output_data[outrow];
    for (outcol = 0, outcol_h = 0; outcol < output_cols;
	 outcol++, outcol_h += h_expand) {
      outvalue = 0;
      for (v = 0; v < v_expand; v++) {
	inptr = input_data[inrow+v] + outcol_h;
	for (h = 0; h < h_expand; h++) {
	  outvalue += (INT32) GETJSAMPLE(*inptr++);
	}
      }
      *outptr++ = (JSAMPLE) ((outvalue + numpix2) / numpix);
    }
    inrow += v_expand;
    outrow++;
  }
}